

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

int Fl::clipboard_contains(char *type)

{
  Fl_X *pFVar1;
  Atom AVar2;
  int iVar3;
  int iVar4;
  Fl_X *xTemp;
  Fl_Window *pFVar5;
  unsigned_long uVar6;
  Window WVar7;
  ulong uVar8;
  uchar *portion;
  unsigned_long count;
  int format;
  unsigned_long remaining;
  Atom actual;
  XEvent event;
  
  portion = (uchar *)0x0;
  pFVar5 = first_window();
  if (pFVar5 == (Fl_Window *)0x0) {
    return 0;
  }
  pFVar1 = pFVar5->i;
  if (pFVar1 == (Fl_X *)0x0) {
    return 0;
  }
  if (pFVar1->xid == 0) {
    return 0;
  }
  if (pFVar1 == (Fl_X *)0x0) {
    WVar7 = 0;
  }
  else {
    WVar7 = pFVar1->xid;
  }
  XConvertSelection(fl_display,CLIPBOARD,TARGETS,CLIPBOARD,WVar7);
  XFlush(fl_display);
  uVar8 = 0xffffffffffffffff;
  do {
    XNextEvent(fl_display,&event);
    if (event.type == 0x1f && event.xkey.time == 0) {
      return 0;
    }
    uVar8 = uVar8 + 1;
  } while ((uVar8 < 0x31) && (event.type != 0x1f));
  if (0x30 < uVar8) {
    return 0;
  }
  XGetWindowProperty(fl_display,event.xany.window,event.xkey.time,0,4000,0,0,&actual,&format,&count,
                     &remaining,&portion);
  if (actual != 4) {
    return 0;
  }
  iVar3 = strcmp(type,"text/plain");
  if (iVar3 == 0) {
    if (count != 0) {
      uVar6 = 0;
      do {
        AVar2 = *(Atom *)(portion + uVar6 * 8);
        iVar3 = 1;
        if ((((AVar2 == fl_Xatextplainutf) || (AVar2 == fl_Xatextplainutf2)) ||
            (AVar2 == fl_Xatextplain)) || (AVar2 == fl_XaUtf8String)) goto LAB_0018d330;
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
  }
  else {
    iVar4 = strcmp(type,"image");
    iVar3 = 0;
    if ((iVar4 != 0) || (iVar3 = 0, count == 0)) goto LAB_0018d330;
    uVar6 = 0;
    do {
      iVar3 = 1;
      if ((*(Atom *)(portion + uVar6 * 8) == fl_XaImageBmp) ||
         (*(Atom *)(portion + uVar6 * 8) == fl_XaImagePNG)) goto LAB_0018d330;
      uVar6 = uVar6 + 1;
    } while (count != uVar6);
  }
  iVar3 = 0;
LAB_0018d330:
  XFree(portion);
  return iVar3;
}

Assistant:

int Fl::clipboard_contains(const char *type)
{
  XEvent event;
  Atom actual; int format; unsigned long count, remaining, i = 0;
  unsigned char* portion = NULL;
  Fl_Window *win = Fl::first_window();
  if (!win || !fl_xid(win)) return 0;
  XConvertSelection(fl_display, CLIPBOARD, TARGETS, CLIPBOARD, fl_xid(win), CurrentTime);
  XFlush(fl_display);
  do  { 
    XNextEvent(fl_display, &event); 
    if (event.type == SelectionNotify && event.xselection.property == None) return 0;
    i++; 
  }
  while (i < 50 && event.type != SelectionNotify);
  if (i >= 50) return 0;
  XGetWindowProperty(fl_display,
		     event.xselection.requestor,
		     event.xselection.property,
		     0, 4000, 0, 0,
		     &actual, &format, &count, &remaining, &portion);
  if (actual != XA_ATOM) return 0;
  Atom t;
  int retval = 0;
  if (strcmp(type, Fl::clipboard_plain_text) == 0) {
    for (i = 0; i<count; i++) { // searching for text data
      t = ((Atom*)portion)[i];
      if (t == fl_Xatextplainutf ||
	  t == fl_Xatextplainutf2 ||
	  t == fl_Xatextplain ||
	  t == fl_XaUtf8String) {
	retval = 1;
	break;
      }
    }	
  }
  else if (strcmp(type, Fl::clipboard_image) == 0) {
    for (i = 0; i<count; i++) { // searching for image data
      t = ((Atom*)portion)[i];
      if (t == fl_XaImageBmp || t == fl_XaImagePNG) {
	retval = 1;
	break;
      }
    }	
  }
  XFree(portion);
  return retval;
}